

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O2

uint flatbuffers::HashFnv1<unsigned_int>(char *input)

{
  uint hash;
  
  hash = 0x811c9dc5;
  while( true ) {
    if (*input == 0) break;
    hash = hash * 0x1000193 ^ (uint)(byte)*input;
    input = (char *)((byte *)input + 1);
  }
  return hash;
}

Assistant:

T HashFnv1(const char *input) {
  T hash = FnvTraits<T>::kOffsetBasis;
  for (const char *c = input; *c; ++c) {
    hash *= FnvTraits<T>::kFnvPrime;
    hash ^= static_cast<unsigned char>(*c);
  }
  return hash;
}